

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O2

bool Speed(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *args)

{
  size_type __n;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  int *piVar7;
  pointer pcVar8;
  long lVar9;
  EVP_AEAD *pEVar10;
  EVP_MD *pEVar11;
  EVP_MD *md;
  EC_GROUP *pEVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true> __s;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s_00;
  TRUST_TOKEN_METHOD *pTVar16;
  ulong uVar17;
  string *psVar18;
  char *pcVar19;
  pointer puVar20;
  pointer pcVar21;
  pointer pcVar22;
  initializer_list<int> __l;
  size_t sStack_55c0;
  allocator<char> local_55a9;
  string selected;
  vector<unsigned_long,_std::allocator<unsigned_long>_> durations;
  size_t alice_msg_len;
  undefined8 uStack_5560;
  code *local_5558;
  code *pcStack_5550;
  UniquePtr<BIGNUM> e;
  allocator<char> local_551e;
  allocator<char> local_551d;
  allocator<char> local_551c;
  allocator<char> local_551b;
  allocator<char> local_551a;
  allocator<char> local_5519;
  allocator<char> local_5518;
  allocator<char> local_5517;
  allocator<char> local_5516;
  allocator<char> local_5515;
  allocator<char> local_5514;
  allocator<char> local_5513;
  allocator<char> local_5512;
  allocator<char> local_5511;
  allocator<char> local_5510;
  allocator<char> local_550f;
  allocator<char> local_550e;
  allocator<char> local_550d;
  allocator<char> local_550c;
  allocator<char> local_550b;
  allocator<char> local_550a;
  allocator<char> local_5509;
  ulong *local_5508;
  __array out_encoded_signature;
  TimeResults results_5;
  TimeResults results;
  TimeResults results_2;
  UniquePtr<RSA> key;
  string *local_5480;
  __single_object pub_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args_map;
  uint sig_len;
  string *local_5420;
  string local_5418;
  string local_53f8;
  string local_53d8;
  string local_53b8;
  string local_5398;
  string local_5378;
  string local_5358;
  string local_5338;
  string local_5318;
  string local_52f8;
  string local_52d8;
  string local_52b8;
  string local_5298;
  string local_5278;
  string local_5258;
  string local_5238;
  string local_5218;
  string local_51f8;
  string local_51d8;
  string local_51b8;
  string local_5198;
  string local_5178;
  string local_5158;
  string local_5138;
  string local_5118;
  string local_50f8;
  UniquePtr<SPAKE2_CTX> alice;
  uint8_t fake_sha256_hash [32];
  uint8_t public_key [32];
  string name;
  char *ptr;
  undefined4 uStack_2870;
  undefined4 uStack_286c;
  code *local_2868;
  code *local_2860;
  
  args_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args_map._M_t._M_impl.super__Rb_tree_header._M_header;
  args_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = ParseKeyValueArguments(&args_map,args,kArguments);
  if (!bVar1) {
    PrintUsage(kArguments);
    bVar1 = false;
    goto LAB_00127fae;
  }
  selected._M_dataplus._M_p = (pointer)&selected.field_2;
  selected._M_string_length = 0;
  selected.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ptr,"-filter",(allocator<char> *)&name);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&args_map,(key_type *)&ptr);
  std::__cxx11::string::~string((string *)&ptr);
  if (sVar5 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ptr,"-filter",(allocator<char> *)&name);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&args_map,(key_type *)&ptr);
    std::__cxx11::string::_M_assign((string *)&selected);
    std::__cxx11::string::~string((string *)&ptr);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ptr,"-json",(allocator<char> *)&name);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&args_map,(key_type *)&ptr);
  std::__cxx11::string::~string((string *)&ptr);
  if (sVar5 != 0) {
    g_print_json = '\x01';
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ptr,"-timeout",(allocator<char> *)&name);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&args_map,(key_type *)&ptr);
  std::__cxx11::string::~string((string *)&ptr);
  if (sVar5 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ptr,"-timeout",(allocator<char> *)&name);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&args_map,(key_type *)&ptr);
    iVar3 = atoi((pmVar6->_M_dataplus)._M_p);
    g_timeout_seconds = (uint64_t)iVar3;
    std::__cxx11::string::~string((string *)&ptr);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ptr,"-threads",(allocator<char> *)&name);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&args_map,(key_type *)&ptr);
  std::__cxx11::string::~string((string *)&ptr);
  if (sVar5 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ptr,"-threads",(allocator<char> *)&name);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&args_map,(key_type *)&ptr);
    g_threads = atoi((pmVar6->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&ptr);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ptr,"-chunks",(allocator<char> *)&name);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&args_map,(key_type *)&ptr);
  std::__cxx11::string::~string((string *)&ptr);
  if (sVar5 != 0) {
    if (g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           g_chunk_lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ptr,"-chunks",(allocator<char> *)&name);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&args_map,(key_type *)&ptr);
    pcVar21 = (pmVar6->_M_dataplus)._M_p;
    std::__cxx11::string::~string((string *)&ptr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ptr,"-chunks",(allocator<char> *)&name);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&args_map,(key_type *)&ptr);
    pcVar22 = pcVar21 + pmVar6->_M_string_length;
    std::__cxx11::string::~string((string *)&ptr);
LAB_001269dd:
    if (pcVar21 != pcVar22) {
      piVar7 = __errno_location();
      *piVar7 = 0;
      pcVar8 = (pointer)strtoull(pcVar21,&ptr,10);
      pcVar19 = ptr;
      if ((ptr != pcVar21) && (*piVar7 != 0x22)) goto code_r0x00126a1a;
      goto LAB_00127ea3;
    }
  }
  if (g_print_json == '\x01') {
    puts("[");
  }
  if ((selected._M_string_length == 0) ||
     (lVar9 = std::__cxx11::string::find((char *)&selected,0x234334), lVar9 != -1)) {
    if ((SpeedRSA(std::__cxx11::string_const&)::kRSAKeys == '\0') &&
       (iVar3 = __cxa_guard_acquire(&SpeedRSA(std::__cxx11::string_const&)::kRSAKeys), iVar3 != 0))
    {
      SpeedRSA(std::__cxx11::string_const&)::kRSAKeys = "RSA 2048";
      _DAT_002fe758 = kDERRSAPrivate2048;
      _DAT_002fe760 = 0x4a7;
      _DAT_002fe768 = "RSA 3072";
      _DAT_002fe770 = kDERRSAPrivate3072;
      _DAT_002fe778 = 0x6e8;
      _DAT_002fe780 = "RSA 4096";
      _DAT_002fe788 = kDERRSAPrivate4096;
      _DAT_002fe790 = 0x92c;
      __cxa_guard_release(&SpeedRSA(std::__cxx11::string_const&)::kRSAKeys);
    }
    for (results_2.num_calls = 0; results_2.num_calls < 3;
        results_2.num_calls = results_2.num_calls + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,
                 (&SpeedRSA(std::__cxx11::string_const&)::kRSAKeys)[results_2.num_calls * 3],
                 (allocator<char> *)&ptr);
      key._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)
           RSA_private_key_from_bytes
                     (*(uint8_t **)(&DAT_002fe758 + results_2.num_calls * 0x18),
                      *(size_t *)(&DAT_002fe760 + results_2.num_calls * 0x18));
      if ((tuple<rsa_st_*,_bssl::internal::Deleter>)
          key._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_rsa_st_*,_false>)0x0) {
        fprintf(_stderr,"Failed to parse %s key.\n",name._M_dataplus._M_p);
        ERR_print_errors_fp(_stderr);
LAB_00127f88:
        std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&key);
        psVar18 = &name;
        goto LAB_00127f9d;
      }
      uVar4 = RSA_size((RSA *)key._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl);
      if (0x200 < uVar4) {
        abort();
      }
      fake_sha256_hash[0x10] = '\0';
      fake_sha256_hash[0x11] = '\0';
      fake_sha256_hash[0x12] = '\0';
      fake_sha256_hash[0x13] = '\0';
      fake_sha256_hash[0x14] = '\0';
      fake_sha256_hash[0x15] = '\0';
      fake_sha256_hash[0x16] = '\0';
      fake_sha256_hash[0x17] = '\0';
      fake_sha256_hash[0x18] = '\0';
      fake_sha256_hash[0x19] = '\0';
      fake_sha256_hash[0x1a] = '\0';
      fake_sha256_hash[0x1b] = '\0';
      fake_sha256_hash[0x1c] = '\0';
      fake_sha256_hash[0x1d] = '\0';
      fake_sha256_hash[0x1e] = '\0';
      fake_sha256_hash[0x1f] = '\0';
      fake_sha256_hash[0] = '\0';
      fake_sha256_hash[1] = '\0';
      fake_sha256_hash[2] = '\0';
      fake_sha256_hash[3] = '\0';
      fake_sha256_hash[4] = '\0';
      fake_sha256_hash[5] = '\0';
      fake_sha256_hash[6] = '\0';
      fake_sha256_hash[7] = '\0';
      fake_sha256_hash[8] = '\0';
      fake_sha256_hash[9] = '\0';
      fake_sha256_hash[10] = '\0';
      fake_sha256_hash[0xb] = '\0';
      fake_sha256_hash[0xc] = '\0';
      fake_sha256_hash[0xd] = '\0';
      fake_sha256_hash[0xe] = '\0';
      fake_sha256_hash[0xf] = '\0';
      public_key._0_8_ = &key;
      public_key._8_8_ = fake_sha256_hash;
      public_key._24_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:333:41)>
           ::_M_invoke;
      public_key._16_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:333:41)>
           ::_M_manager;
      bVar1 = TimeFunctionParallel(&results,(function<bool_()> *)public_key);
      std::_Function_base::~_Function_base((_Function_base *)public_key);
      if (!bVar1) {
        fwrite("RSA_sign failed.\n",0x11,1,_stderr);
        ERR_print_errors_fp(_stderr);
        goto LAB_00127f88;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr,&name
                     ," signing");
      TimeResults::Print(&results,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ptr);
      std::__cxx11::string::~string((string *)&ptr);
      iVar3 = RSA_sign(0x2a0,fake_sha256_hash,0x20,(uchar *)&ptr,&sig_len,
                       (RSA *)key._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl);
      uVar4 = sig_len;
      if (iVar3 == 0) goto LAB_00127f88;
      alice._M_t.super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_spake2_ctx_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>)0x0;
      alice._M_t.super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_spake2_ctx_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>)operator_new(0x20);
      *(UniquePtr<RSA> **)
       alice._M_t.super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_spake2_ctx_st_*,_false>._M_head_impl = &key;
      *(uint8_t **)
       ((long)alice._M_t.super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_spake2_ctx_st_*,_false>._M_head_impl + 8) = fake_sha256_hash;
      *(char ***)
       ((long)alice._M_t.super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_spake2_ctx_st_*,_false>._M_head_impl + 0x10) = &ptr;
      *(uint *)((long)alice._M_t.super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_spake2_ctx_st_*,_false>._M_head_impl + 0x18) = uVar4;
      bVar1 = TimeFunctionParallel(&results,(function<bool_()> *)&alice);
      std::_Function_base::~_Function_base((_Function_base *)&alice);
      if (!bVar1) {
LAB_00127eeb:
        fwrite("RSA_verify failed.\n",0x13,1,_stderr);
LAB_00127f79:
        ERR_print_errors_fp(_stderr);
        goto LAB_00127f88;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &alice_msg_len,&name," verify (same key)");
      TimeResults::Print(&results,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&alice_msg_len);
      std::__cxx11::string::~string((string *)&alice_msg_len);
      uVar4 = sig_len;
      durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
      *durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start = (unsigned_long)&key;
      durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[1] = (unsigned_long)fake_sha256_hash;
      durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[2] = (unsigned_long)&ptr;
      *(uint *)(durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + 3) = uVar4;
      durations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:367:23)>
                    ::_M_manager;
      bVar1 = TimeFunctionParallel(&results,(function<bool_()> *)&durations);
      std::_Function_base::~_Function_base((_Function_base *)&durations);
      if (!bVar1) goto LAB_00127eeb;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &alice_msg_len,&name," verify (fresh key)");
      TimeResults::Print(&results,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&alice_msg_len);
      std::__cxx11::string::~string((string *)&alice_msg_len);
      e._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)&results_2;
      bVar1 = TimeFunctionParallel(&results,(function<bool_()> *)&e);
      std::_Function_base::~_Function_base((_Function_base *)&e);
      if (!bVar1) {
        fprintf(_stderr,"Failed to parse %s key.\n",name._M_dataplus._M_p);
        goto LAB_00127f79;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &alice_msg_len,&name," private key parse");
      TimeResults::Print(&results,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&alice_msg_len);
      std::__cxx11::string::~string((string *)&alice_msg_len);
      std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&key);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  pEVar10 = EVP_aead_aegis_128l();
  std::__cxx11::string::string<std::allocator<char>>((string *)&key,"AEGIS-128L",&local_5509);
  bVar1 = SpeedAEAD(pEVar10,(string *)&key,0xd,&selected);
  if (bVar1) {
    pEVar10 = EVP_aead_aegis_128x2();
    std::__cxx11::string::string<std::allocator<char>>((string *)&sig_len,"AEGIS-128X2",&local_550a)
    ;
    bVar1 = SpeedAEAD(pEVar10,(string *)&sig_len,0xd,&selected);
    if (!bVar1) {
LAB_00127ed1:
      std::__cxx11::string::~string((string *)&sig_len);
      goto LAB_00127ede;
    }
    pEVar10 = EVP_aead_aegis_256();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5418,"AEGIS-256",&local_550b);
    bVar1 = SpeedAEAD(pEVar10,&local_5418,0xd,&selected);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&local_5418);
      goto LAB_00127ed1;
    }
    pEVar10 = EVP_aead_aes_128_gcm();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50f8,"AES-128-GCM",&local_550c);
    bVar2 = SpeedAEAD(pEVar10,&local_50f8,0xd,&selected);
    bVar1 = true;
    if (bVar2) {
      pEVar10 = EVP_aead_aes_256_gcm();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5118,"AES-256-GCM",&local_550d);
      bVar2 = SpeedAEAD(pEVar10,&local_5118,0xd,&selected);
      bVar1 = true;
      if (bVar2) {
        pEVar10 = EVP_aead_chacha20_poly1305();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5138,"ChaCha20-Poly1305",&local_550e);
        bVar2 = SpeedAEAD(pEVar10,&local_5138,0xd,&selected);
        bVar1 = true;
        if (bVar2) {
          pEVar10 = EVP_aead_des_ede3_cbc_sha1_tls();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5158,"DES-EDE3-CBC-SHA1",&local_550f);
          bVar2 = SpeedAEAD(pEVar10,&local_5158,0xb,&selected);
          bVar1 = true;
          if (bVar2) {
            pEVar10 = EVP_aead_aes_128_cbc_sha1_tls();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5178,"AES-128-CBC-SHA1",&local_5510);
            bVar2 = SpeedAEAD(pEVar10,&local_5178,0xb,&selected);
            bVar1 = true;
            if (bVar2) {
              pEVar10 = EVP_aead_aes_256_cbc_sha1_tls();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_5198,"AES-256-CBC-SHA1",&local_5511);
              bVar2 = SpeedAEAD(pEVar10,&local_5198,0xb,&selected);
              bVar1 = true;
              if (bVar2) {
                pEVar10 = EVP_aead_aes_128_cbc_sha1_tls();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_51b8,"AES-128-CBC-SHA1",&local_5512);
                bVar2 = SpeedAEADOpen(pEVar10,&local_51b8,0xb,&selected);
                bVar1 = true;
                if (bVar2) {
                  pEVar10 = EVP_aead_aes_256_cbc_sha1_tls();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_51d8,"AES-256-CBC-SHA1",&local_5513);
                  bVar2 = SpeedAEADOpen(pEVar10,&local_51d8,0xb,&selected);
                  bVar1 = true;
                  if (bVar2) {
                    pEVar10 = EVP_aead_aes_128_gcm_siv();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_51f8,"AES-128-GCM-SIV",&local_5514);
                    bVar2 = SpeedAEAD(pEVar10,&local_51f8,0xd,&selected);
                    bVar1 = true;
                    if (bVar2) {
                      pEVar10 = EVP_aead_aes_256_gcm_siv();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_5218,"AES-256-GCM-SIV",&local_5515);
                      bVar2 = SpeedAEAD(pEVar10,&local_5218,0xd,&selected);
                      bVar1 = true;
                      if (bVar2) {
                        pEVar10 = EVP_aead_aes_128_gcm_siv();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_5238,"AES-128-GCM-SIV",&local_5516);
                        bVar2 = SpeedAEADOpen(pEVar10,&local_5238,0xd,&selected);
                        bVar1 = true;
                        if (bVar2) {
                          pEVar10 = EVP_aead_aes_256_gcm_siv();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_5258,"AES-256-GCM-SIV",&local_5517);
                          bVar2 = SpeedAEADOpen(pEVar10,&local_5258,0xd,&selected);
                          bVar1 = true;
                          if (bVar2) {
                            pEVar10 = EVP_aead_aes_128_ccm_bluetooth();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_5278,"AES-128-CCM-Bluetooth",&local_5518);
                            bVar2 = SpeedAEAD(pEVar10,&local_5278,0xd,&selected);
                            bVar1 = true;
                            if (bVar2) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_5298,"AES-128",&local_5519);
                              bVar2 = SpeedAESBlock(&local_5298,0x80,&selected);
                              bVar1 = true;
                              if (bVar2) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_52b8,"AES-256",&local_551a);
                                bVar2 = SpeedAESBlock(&local_52b8,0x100,&selected);
                                bVar1 = true;
                                if (bVar2) {
                                  pEVar11 = EVP_sha1();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_52d8,"SHA-1",&local_551b);
                                  bVar2 = SpeedHash((EVP_MD *)pEVar11,&local_52d8,&selected);
                                  bVar1 = true;
                                  if (bVar2) {
                                    pEVar11 = EVP_sha256();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_52f8,"SHA-256",&local_551c);
                                    bVar2 = SpeedHash((EVP_MD *)pEVar11,&local_52f8,&selected);
                                    bVar1 = true;
                                    if (bVar2) {
                                      pEVar11 = EVP_sha512();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_5318,"SHA-512",&local_551d);
                                      bVar2 = SpeedHash((EVP_MD *)pEVar11,&local_5318,&selected);
                                      bVar1 = true;
                                      if (bVar2) {
                                        md = EVP_blake2b256();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_5338,"BLAKE2b-256",&local_551e);
                                        bVar2 = SpeedHash(md,&local_5338,&selected);
                                        bVar1 = true;
                                        if (!bVar2) goto LAB_0012819c;
                                        if ((selected._M_string_length == 0) ||
                                           (bVar2 = std::operator!=(&selected,"RNG"), !bVar2)) {
                                          local_5508 = g_chunk_lengths.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                          for (puVar20 = g_chunk_lengths.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                              puVar20 != local_5508; puVar20 = puVar20 + 1) {
                                            pcVar21 = (pointer)*puVar20;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)fake_sha256_hash,"RNG",
                                                       (allocator<char> *)public_key);
                                            if ((pointer)0x4000 < pcVar21) {
LAB_0012816b:
                                              psVar18 = (string *)fake_sha256_hash;
                                              goto LAB_00128197;
                                            }
                                            ChunkLenSuffix_abi_cxx11_
                                                      ((string *)&ptr,(size_t)pcVar21);
                                            std::__cxx11::string::append((string *)fake_sha256_hash)
                                            ;
                                            std::__cxx11::string::~string((string *)&ptr);
                                            name._M_string_length = 0;
                                            name.field_2._8_8_ =
                                                 std::
                                                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:720:39)>
                                                 ::_M_invoke;
                                            name.field_2._M_allocated_capacity =
                                                 (size_type)
                                                 std::
                                                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:720:39)>
                                                 ::_M_manager;
                                            name._M_dataplus._M_p = pcVar21;
                                            bVar2 = TimeFunctionParallel
                                                              ((TimeResults *)&ptr,
                                                               (function<bool_()> *)&name);
                                            std::_Function_base::~_Function_base
                                                      ((_Function_base *)&name);
                                            if (!bVar2) goto LAB_0012816b;
                                            TimeResults::PrintWithBytes
                                                      ((TimeResults *)&ptr,
                                                       (string *)fake_sha256_hash,(size_t)pcVar21);
                                            std::__cxx11::string::~string
                                                      ((string *)fake_sha256_hash);
                                          }
                                        }
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&ptr,"ECDH P-224",
                                                   (allocator<char> *)&alice);
                                        pEVar12 = EC_group_p224();
                                        bVar2 = SpeedECDHCurve((string *)&ptr,pEVar12,&selected);
                                        if (bVar2) {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&name,"ECDH P-256",
                                                     (allocator<char> *)&alice_msg_len);
                                          pEVar12 = EC_group_p256();
                                          bVar2 = SpeedECDHCurve(&name,pEVar12,&selected);
                                          if (!bVar2) {
LAB_00128182:
                                            std::__cxx11::string::~string((string *)&name);
                                            goto LAB_0012818f;
                                          }
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)fake_sha256_hash,"ECDH P-384",
                                                     (allocator<char> *)&durations);
                                          pEVar12 = EC_group_p384();
                                          bVar2 = SpeedECDHCurve((string *)fake_sha256_hash,pEVar12,
                                                                 &selected);
                                          if (!bVar2) {
LAB_00128175:
                                            std::__cxx11::string::~string
                                                      ((string *)fake_sha256_hash);
                                            goto LAB_00128182;
                                          }
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)public_key,"ECDH P-521",
                                                     (allocator<char> *)&e);
                                          pEVar12 = EC_group_p521();
                                          bVar2 = SpeedECDHCurve((string *)public_key,pEVar12,
                                                                 &selected);
                                          std::__cxx11::string::~string((string *)public_key);
                                          std::__cxx11::string::~string((string *)fake_sha256_hash);
                                          std::__cxx11::string::~string((string *)&name);
                                          std::__cxx11::string::~string((string *)&ptr);
                                          if (!bVar2) goto LAB_0012819c;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&ptr,"ECDSA P-224",
                                                     (allocator<char> *)&alice);
                                          pEVar12 = EC_group_p224();
                                          bVar2 = SpeedECDSACurve((string *)&ptr,pEVar12,&selected);
                                          if (!bVar2) goto LAB_0012818f;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&name,"ECDSA P-256",
                                                     (allocator<char> *)&alice_msg_len);
                                          pEVar12 = EC_group_p256();
                                          bVar2 = SpeedECDSACurve(&name,pEVar12,&selected);
                                          if (!bVar2) goto LAB_00128182;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)fake_sha256_hash,"ECDSA P-384",
                                                     (allocator<char> *)&durations);
                                          pEVar12 = EC_group_p384();
                                          bVar2 = SpeedECDSACurve((string *)fake_sha256_hash,pEVar12
                                                                  ,&selected);
                                          if (!bVar2) goto LAB_00128175;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)public_key,"ECDSA P-521",
                                                     (allocator<char> *)&e);
                                          pEVar12 = EC_group_p521();
                                          bVar2 = SpeedECDSACurve((string *)public_key,pEVar12,
                                                                  &selected);
                                          std::__cxx11::string::~string((string *)public_key);
                                          std::__cxx11::string::~string((string *)fake_sha256_hash);
                                          std::__cxx11::string::~string((string *)&name);
                                          std::__cxx11::string::~string((string *)&ptr);
                                          if (!bVar2) goto LAB_0012819c;
                                          if ((selected._M_string_length == 0) ||
                                             (lVar9 = std::__cxx11::string::find
                                                                ((char *)&selected,0x248e81),
                                             lVar9 != -1)) {
                                            fake_sha256_hash[0] = '\0';
                                            fake_sha256_hash[1] = '\0';
                                            fake_sha256_hash[2] = '\0';
                                            fake_sha256_hash[3] = '\0';
                                            fake_sha256_hash[4] = '\0';
                                            fake_sha256_hash[5] = '\0';
                                            fake_sha256_hash[6] = '\0';
                                            fake_sha256_hash[7] = '\0';
                                            fake_sha256_hash[8] = '\0';
                                            fake_sha256_hash[9] = '\0';
                                            fake_sha256_hash[10] = '\0';
                                            fake_sha256_hash[0xb] = '\0';
                                            fake_sha256_hash[0xc] = '\0';
                                            fake_sha256_hash[0xd] = '\0';
                                            fake_sha256_hash[0xe] = '\0';
                                            fake_sha256_hash[0xf] = '\0';
                                            fake_sha256_hash._24_8_ =
                                                 std::
                                                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:873:39)>
                                                 ::_M_invoke;
                                            fake_sha256_hash._16_8_ =
                                                 std::
                                                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:873:39)>
                                                 ::_M_manager;
                                            bVar2 = TimeFunctionParallel
                                                              (&results_2,
                                                               (function<bool_()> *)fake_sha256_hash
                                                              );
                                            std::_Function_base::~_Function_base
                                                      ((_Function_base *)fake_sha256_hash);
                                            if (bVar2) {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&ptr,"Ed25519 key generation",
                                                         (allocator<char> *)&name);
                                              TimeResults::Print(&results_2,(string *)&ptr);
                                              std::__cxx11::string::~string((string *)&ptr);
                                              ED25519_keypair(public_key,(uint8_t *)&ptr);
                                              alice._M_t.
                                              super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                              _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )&ptr;
                                              bVar2 = TimeFunctionParallel
                                                                (&results_2,
                                                                 (function<bool_()> *)&alice);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)&alice);
                                              if (bVar2) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&name,"Ed25519 signing",
                                                           (allocator<char> *)&durations);
                                                TimeResults::Print(&results_2,&name);
                                                std::__cxx11::string::~string((string *)&name);
                                                iVar3 = ED25519_sign((uint8_t *)&name,"",6,
                                                                     (uint8_t *)&ptr);
                                                if (iVar3 != 0) {
                                                  pcStack_5550 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:901:39)>
                                                  ::_M_invoke;
                                                  local_5558 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:901:39)>
                                                  ::_M_manager;
                                                  alice_msg_len = (size_t)public_key;
                                                  uStack_5560 = &name;
                                                  bVar2 = TimeFunctionParallel
                                                                    (&results_2,
                                                                     (function<bool_()> *)
                                                                     &alice_msg_len);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&alice_msg_len);
                                                  if (bVar2) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&durations,"Ed25519 verify"
                                                               ,(allocator<char> *)&results_5);
                                                    TimeResults::Print(&results_2,
                                                                       (string *)&durations);
                                                    std::__cxx11::string::~string
                                                              ((string *)&durations);
                                                    e._M_t.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl = (
                                                  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  )0x0;
                                                  bVar2 = TimeFunctionParallel
                                                                    (&results_2,
                                                                     (function<bool_()> *)&e);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&e);
                                                  if (bVar2) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&durations,
                                                                                                                              
                                                  "Curve25519 base-point multiplication",
                                                  (allocator<char> *)&results_5);
                                                  TimeResults::Print(&results_2,(string *)&durations
                                                                    );
                                                  std::__cxx11::string::~string
                                                            ((string *)&durations);
                                                  results.num_calls = 0;
                                                  results.us = 0;
                                                  bVar2 = TimeFunctionParallel
                                                                    (&results_2,
                                                                     (function<bool_()> *)&results);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&results);
                                                  if (bVar2) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&durations,
                                                                                                                              
                                                  "Curve25519 arbitrary point multiplication",
                                                  (allocator<char> *)&results_5);
                                                  TimeResults::Print(&results_2,(string *)&durations
                                                                    );
                                                  std::__cxx11::string::~string
                                                            ((string *)&durations);
                                                  goto LAB_0012797a;
                                                  }
                                                  pcVar19 = 
                                                  "Curve25519 arbitrary point multiplication failed.\n"
                                                  ;
                                                  sStack_55c0 = 0x32;
                                                  }
                                                  else {
                                                    pcVar19 = 
                                                  "Curve25519 base-point multiplication failed.\n";
                                                  sStack_55c0 = 0x2d;
                                                  }
                                                  goto LAB_0012971e;
                                                  }
                                                  pcVar19 = "Ed25519 verify failed.\n";
LAB_00129537:
                                                  sStack_55c0 = 0x17;
                                                  goto LAB_0012971e;
                                                }
                                              }
                                            }
                                            goto LAB_0012819c;
                                          }
LAB_0012797a:
                                          if ((selected._M_string_length == 0) ||
                                             (lVar9 = std::__cxx11::string::find
                                                                ((char *)&selected,0x22fd6d),
                                             lVar9 != -1)) {
                                            alice._M_t.
                                            super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                            _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )SPAKE2_CTX_new(spake2_role_alice,
                                                                  (uint8_t *)"ABpassword",1,
                                                                  "Bpassword",1);
                                            iVar3 = SPAKE2_generate_msg((SPAKE2_CTX *)
                                                                        alice._M_t.
                                                                                                                                                
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl,(uint8_t *)&ptr,&alice_msg_len,0x20,
                                                  "password",9);
                                            if (iVar3 == 0) {
                                              fwrite("SPAKE2_generate_msg failed.\n",0x1c,1,_stderr)
                                              ;
                                            }
                                            else {
                                              name._M_string_length = alice_msg_len;
                                              name.field_2._8_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:962:39)>
                                                  ::_M_invoke;
                                              name.field_2._M_allocated_capacity =
                                                   (size_type)
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:962:39)>
                                                  ::_M_manager;
                                              name._M_dataplus._M_p = (pointer)&ptr;
                                              bVar2 = TimeFunctionParallel
                                                                ((TimeResults *)public_key,
                                                                 (function<bool_()> *)&name);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)&name);
                                              if (!bVar2) {
                                                fwrite("SPAKE2 failed.\n",0xf,1,_stderr);
                                              }
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)fake_sha256_hash,
                                                         "SPAKE2 over Ed25519",
                                                         (allocator<char> *)&durations);
                                              TimeResults::Print((TimeResults *)public_key,
                                                                 (string *)fake_sha256_hash);
                                              std::__cxx11::string::~string
                                                        ((string *)fake_sha256_hash);
                                            }
                                            std::unique_ptr<spake2_ctx_st,_bssl::internal::Deleter>
                                            ::~unique_ptr(&alice);
                                            if (iVar3 == 0) goto LAB_0012819c;
                                          }
                                          if ((selected._M_string_length == 0) ||
                                             (lVar9 = std::__cxx11::string::find
                                                                ((char *)&selected,0x22fdb5),
                                             lVar9 != -1)) {
                                            ptr = (char *)0x0;
                                            _uStack_2870 = (TimeResults *)0x0;
                                            local_2860 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:996:39)>
                                                  ::_M_invoke;
                                            local_2868 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:996:39)>
                                                  ::_M_manager;
                                            bVar2 = TimeFunctionParallel
                                                              ((TimeResults *)public_key,
                                                               (function<bool_()> *)&ptr);
                                            std::_Function_base::~_Function_base
                                                      ((_Function_base *)&ptr);
                                            if (bVar2) {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&name,
                                                         "scrypt (N = 1024, r = 8, p = 16)",
                                                         (allocator<char> *)&alice);
                                              TimeResults::Print((TimeResults *)public_key,&name);
                                              std::__cxx11::string::~string((string *)&name);
                                              fake_sha256_hash[0] = '\0';
                                              fake_sha256_hash[1] = '\0';
                                              fake_sha256_hash[2] = '\0';
                                              fake_sha256_hash[3] = '\0';
                                              fake_sha256_hash[4] = '\0';
                                              fake_sha256_hash[5] = '\0';
                                              fake_sha256_hash[6] = '\0';
                                              fake_sha256_hash[7] = '\0';
                                              fake_sha256_hash[8] = '\0';
                                              fake_sha256_hash[9] = '\0';
                                              fake_sha256_hash[10] = '\0';
                                              fake_sha256_hash[0xb] = '\0';
                                              fake_sha256_hash[0xc] = '\0';
                                              fake_sha256_hash[0xd] = '\0';
                                              fake_sha256_hash[0xe] = '\0';
                                              fake_sha256_hash[0xf] = '\0';
                                              fake_sha256_hash._24_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1007:39)>
                                                  ::_M_invoke;
                                              fake_sha256_hash._16_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1007:39)>
                                                  ::_M_manager;
                                              bVar2 = TimeFunctionParallel
                                                                ((TimeResults *)public_key,
                                                                 (function<bool_()> *)
                                                                 fake_sha256_hash);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)fake_sha256_hash);
                                              if (bVar2) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&name,
                                                           "scrypt (N = 16384, r = 8, p = 1)",
                                                           (allocator<char> *)&alice);
                                                TimeResults::Print((TimeResults *)public_key,&name);
                                                std::__cxx11::string::~string((string *)&name);
                                                goto LAB_00127bc2;
                                              }
                                            }
                                            pcVar19 = "scrypt failed.\n";
                                            sStack_55c0 = 0xf;
                                            goto LAB_0012971e;
                                          }
LAB_00127bc2:
                                          bVar2 = std::operator!=(&selected,"RSAKeyGen");
                                          if (!bVar2) {
                                            e._M_t.
                                            super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                                 = (
                                                  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>
                                                  )BN_new();
                                            iVar3 = BN_set_word((BIGNUM *)
                                                                e._M_t.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl,0x10001);
                                            if (iVar3 != 0) {
                                              ptr = (char *)0xc0000000800;
                                              uStack_2870 = 0x1000;
                                              __l._M_len = 3;
                                              __l._M_array = (iterator)&ptr;
                                              std::vector<int,_std::allocator<int>_>::vector
                                                        ((vector<int,_std::allocator<int>_> *)
                                                         &alice_msg_len,__l,(allocator_type *)&name)
                                              ;
                                              local_5480 = (string *)alice_msg_len;
                                              local_5420 = (string *)uStack_5560;
                                              do {
                                                if (local_5480 == local_5420) {
                                                  std::_Vector_base<int,_std::allocator<int>_>::
                                                  ~_Vector_base((
                                                  _Vector_base<int,_std::allocator<int>_> *)
                                                  &alice_msg_len);
                                                  std::
                                                  unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                                  ~unique_ptr(&e);
                                                  goto LAB_001282f7;
                                                }
                                                local_5508 = (ulong *)CONCAT44(local_5508._4_4_,
                                                                               *(undefined4 *)
                                                                                &(local_5480->
                                                                                 _M_dataplus)._M_p);
                                                uVar13 = time_now();
                                                durations.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start =
                                                     (pointer)0x0;
                                                durations.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_finish =
                                                     (pointer)0x0;
                                                durations.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                     (pointer)0x0;
                                                pcVar21 = (pointer)0x0;
                                                do {
                                                  ptr = (char *)RSA_new();
                                                  uVar14 = time_now();
                                                  iVar3 = RSA_generate_key_ex((RSA *)ptr,
                                                                              (int)local_5508,
                                                                              (BIGNUM *)
                                                                              e._M_t.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl,(BN_GENCB *)0x0);
                                                  if (iVar3 == 0) {
                                                    fwrite("RSA_generate_key_ex failed.\n",0x1c,1,
                                                           _stderr);
                                                    ERR_print_errors_fp(_stderr);
                                                    std::unique_ptr<rsa_st,_bssl::internal::Deleter>
                                                    ::~unique_ptr((
                                                  unique_ptr<rsa_st,_bssl::internal::Deleter> *)&ptr
                                                  );
                                                  goto LAB_00127e4f;
                                                  }
                                                  uVar15 = time_now();
                                                  name._M_dataplus._M_p = (pointer)(uVar15 - uVar14)
                                                  ;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::emplace_back<unsigned_long>
                                                            (&durations,(unsigned_long *)&name);
                                                  pcVar21 = pcVar21 + 1;
                                                  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::
                                                  ~unique_ptr((
                                                  unique_ptr<rsa_st,_bssl::internal::Deleter> *)&ptr
                                                  );
                                                } while (uVar15 - uVar13 < 0x1c9c381);
                                                std::
                                                __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                                                          (durations.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  durations.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)fake_sha256_hash,"RSA ",
                                                           (allocator<char> *)&results);
                                                std::__cxx11::to_string
                                                          ((string *)public_key,(int)local_5508);
                                                std::operator+(&name,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)fake_sha256_hash,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)public_key);
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&alice," key-gen",
                                                           (allocator<char> *)&results_2);
                                                std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&ptr,&name,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&alice);
                                                std::__cxx11::string::~string((string *)&alice);
                                                std::__cxx11::string::~string((string *)&name);
                                                std::__cxx11::string::~string((string *)public_key);
                                                std::__cxx11::string::~string
                                                          ((string *)fake_sha256_hash);
                                                name._M_dataplus._M_p = pcVar21;
                                                name._M_string_length = uVar15 - uVar13;
                                                TimeResults::Print((TimeResults *)&name,
                                                                   (string *)&ptr);
                                                if ((long)durations.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)durations.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start == 0) {
                                                  __assert_fail("n > 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc"
                                                  ,0x1be,"bool SpeedRSAKeyGen(const std::string &)")
                                                  ;
                                                }
                                                if (g_print_json == '\0') {
                                                  uVar17 = (ulong)((long)durations.
                                                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)durations.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) >>
                                                  1;
                                                  if (((long)durations.
                                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)durations.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 8U) ==
                                                  0) {
                                                    uVar17 = durations.
                                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar17]
                                                  + durations.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar17 - 1] >> 1;
                                                  }
                                                  else {
                                                    uVar17 = durations.
                                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar17];
                                                  }
                                                  printf("  min: %luus, median: %luus, max: %luus\n"
                                                         ,*durations.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,uVar17);
                                                }
                                                std::__cxx11::string::~string((string *)&ptr);
LAB_00127e4f:
                                                std::
                                                _Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ::~_Vector_base(&durations.
                                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  );
                                                local_5480 = (string *)
                                                             ((long)&(local_5480->_M_dataplus)._M_p
                                                             + 4);
                                              } while (iVar3 != 0);
                                              std::_Vector_base<int,_std::allocator<int>_>::
                                              ~_Vector_base((_Vector_base<int,_std::allocator<int>_>
                                                             *)&alice_msg_len);
                                            }
                                            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::
                                            ~unique_ptr(&e);
                                            goto LAB_0012819c;
                                          }
LAB_001282f7:
                                          if ((selected._M_string_length != 0) &&
                                             (bVar2 = std::operator!=(&selected,"HRSS"), bVar2)) {
LAB_0012851e:
                                            if ((selected._M_string_length == 0) ||
                                               (bVar2 = std::operator!=(&selected,"Kyber"), !bVar2))
                                            {
                                              memset(public_key,0x2a,0x440);
                                              alice._M_t.
                                              super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                              _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )public_key;
                                              bVar2 = TimeFunctionParallel
                                                                ((TimeResults *)&e,
                                                                 (function<bool_()> *)&alice);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)&alice);
                                              if (bVar2) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&ptr,"Kyber generate + decap",
                                                           (allocator<char> *)&name);
                                                TimeResults::Print((TimeResults *)&e,(string *)&ptr)
                                                ;
                                                std::__cxx11::string::~string((string *)&ptr);
                                                KYBER_generate_key(fake_sha256_hash,
                                                                   (KYBER_private_key *)&ptr);
                                                alice_msg_len = 0;
                                                uStack_5560 = (string *)0x0;
                                                local_5558 = (code *)0x0;
                                                pcStack_5550 = (code *)0x0;
                                                alice_msg_len = (size_t)operator_new(0x18);
                                                *(uint8_t **)alice_msg_len = fake_sha256_hash;
                                                *(string **)(alice_msg_len + 8) = &name;
                                                *(uint8_t **)(alice_msg_len + 0x10) = public_key;
                                                pcStack_5550 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1111:39)>
                                                  ::_M_invoke;
                                                local_5558 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1111:39)>
                                                  ::_M_manager;
                                                bVar2 = TimeFunctionParallel
                                                                  ((TimeResults *)&e,
                                                                   (function<bool_()> *)
                                                                   &alice_msg_len);
                                                std::_Function_base::~_Function_base
                                                          ((_Function_base *)&alice_msg_len);
                                                if (bVar2) {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&durations,
                                                             "Kyber parse + encap",
                                                             (allocator<char> *)&results);
                                                  TimeResults::Print((TimeResults *)&e,
                                                                     (string *)&durations);
                                                  std::__cxx11::string::~string
                                                            ((string *)&durations);
                                                  goto LAB_0012868a;
                                                }
                                                pcVar19 = "Failed to time KYBER_encap.\n";
                                                sStack_55c0 = 0x1c;
                                              }
                                              else {
                                                pcVar19 = 
                                                "Failed to time KYBER_generate_key + KYBER_decap.\n"
                                                ;
                                                sStack_55c0 = 0x31;
                                              }
                                              goto LAB_0012971e;
                                            }
LAB_0012868a:
                                            if ((selected._M_string_length == 0) ||
                                               (bVar2 = std::operator!=(&selected,"ML-DSA"), !bVar2)
                                               ) {
                                              __s.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl = (
                                                  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  )operator_new__(0x7a0);
                                              memset((void *)__s.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl,0,0x7a0);
                                              e._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl = (
                                                  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>
                                                  )__s.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl;
                                              std::make_unique<MLDSA65_private_key>();
                                              ptr = (char *)&e;
                                              local_2860 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1141:39)>
                                                  ::_M_invoke;
                                              local_2868 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1141:39)>
                                                  ::_M_manager;
                                              _uStack_2870 = &results;
                                              bVar2 = TimeFunctionParallel
                                                                ((TimeResults *)&durations,
                                                                 (function<bool_()> *)&ptr);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)&ptr);
                                              if (!bVar2) {
                                                fwrite("Failed to time MLDSA65_generate_key.\n",0x25
                                                       ,1,_stderr);
                                                std::
                                                unique_ptr<MLDSA65_private_key,_std::default_delete<MLDSA65_private_key>_>
                                                ::~unique_ptr((
                                                  unique_ptr<MLDSA65_private_key,_std::default_delete<MLDSA65_private_key>_>
                                                  *)&results);
                                                std::
                                                unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                ::~unique_ptr((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)&e);
                                                goto LAB_0012819c;
                                              }
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&name,"MLDSA key generation",
                                                         (allocator<char> *)&results_2);
                                              TimeResults::Print((TimeResults *)&durations,&name);
                                              std::__cxx11::string::~string((string *)&name);
                                              results_2.num_calls = (uint64_t)anon_var_dwarf_8cae0;
                                              results_5.num_calls = 0xb;
                                              __s_00.
                                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                              .super__Head_base<0UL,_unsigned_char_*,_false>.
                                              _M_head_impl = (
                                                  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  )operator_new__(0xced);
                                              memset((void *)__s_00.
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl,0,0xced);
                                              fake_sha256_hash[0] = '\0';
                                              fake_sha256_hash[1] = '\0';
                                              fake_sha256_hash[2] = '\0';
                                              fake_sha256_hash[3] = '\0';
                                              fake_sha256_hash[4] = '\0';
                                              fake_sha256_hash[5] = '\0';
                                              fake_sha256_hash[6] = '\0';
                                              fake_sha256_hash[7] = '\0';
                                              fake_sha256_hash[8] = '\0';
                                              fake_sha256_hash[9] = '\0';
                                              fake_sha256_hash[10] = '\0';
                                              fake_sha256_hash[0xb] = '\0';
                                              fake_sha256_hash[0xc] = '\0';
                                              fake_sha256_hash[0xd] = '\0';
                                              fake_sha256_hash[0xe] = '\0';
                                              fake_sha256_hash[0xf] = '\0';
                                              fake_sha256_hash[0x10] = '\0';
                                              fake_sha256_hash[0x11] = '\0';
                                              fake_sha256_hash[0x12] = '\0';
                                              fake_sha256_hash[0x13] = '\0';
                                              fake_sha256_hash[0x14] = '\0';
                                              fake_sha256_hash[0x15] = '\0';
                                              fake_sha256_hash[0x16] = '\0';
                                              fake_sha256_hash[0x17] = '\0';
                                              fake_sha256_hash[0x18] = '\0';
                                              fake_sha256_hash[0x19] = '\0';
                                              fake_sha256_hash[0x1a] = '\0';
                                              fake_sha256_hash[0x1b] = '\0';
                                              fake_sha256_hash[0x1c] = '\0';
                                              fake_sha256_hash[0x1d] = '\0';
                                              fake_sha256_hash[0x1e] = '\0';
                                              fake_sha256_hash[0x1f] = '\0';
                                              out_encoded_signature._M_t.
                                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                              .super__Head_base<0UL,_unsigned_char_*,_false>.
                                              _M_head_impl = (
                                                  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                                                  )(
                                                  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                                                  )__s_00.
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl;
                                              fake_sha256_hash._0_8_ = operator_new(0x20);
                                              *(__array **)fake_sha256_hash._0_8_ =
                                                   &out_encoded_signature;
                                              *(TimeResults **)(fake_sha256_hash._0_8_ + 8) =
                                                   &results;
                                              *(TimeResults **)(fake_sha256_hash._0_8_ + 0x10) =
                                                   &results_2;
                                              *(TimeResults **)(fake_sha256_hash._0_8_ + 0x18) =
                                                   &results_5;
                                              fake_sha256_hash._24_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1159:39)>
                                                  ::_M_invoke;
                                              fake_sha256_hash._16_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1159:39)>
                                                  ::_M_manager;
                                              bVar2 = TimeFunctionParallel
                                                                ((TimeResults *)&durations,
                                                                 (function<bool_()> *)
                                                                 fake_sha256_hash);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)fake_sha256_hash);
                                              if (bVar2) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&name,"MLDSA sign (randomized)"
                                                           ,(allocator<char> *)&pub_2);
                                                TimeResults::Print((TimeResults *)&durations,&name);
                                                std::__cxx11::string::~string((string *)&name);
                                                std::make_unique<MLDSA65_public_key>();
                                                public_key._0_8_ = &e;
                                                public_key._24_8_ =
                                                     std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1175:39)>
                                                  ::_M_invoke;
                                                public_key._16_8_ =
                                                     std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1175:39)>
                                                  ::_M_manager;
                                                public_key._8_8_ = &pub_2;
                                                bVar2 = TimeFunctionParallel
                                                                  ((TimeResults *)&durations,
                                                                   (function<bool_()> *)public_key);
                                                std::_Function_base::~_Function_base
                                                          ((_Function_base *)public_key);
                                                if (bVar2) {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&name,
                                                             "MLDSA parse (valid) public key",
                                                             &local_55a9);
                                                  TimeResults::Print((TimeResults *)&durations,&name
                                                                    );
                                                  std::__cxx11::string::~string((string *)&name);
                                                  alice._M_t.
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  )0x0;
                                                  alice._M_t.
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )operator_new(0x20);
                                                  *(__single_object **)
                                                   alice._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl = &pub_2;
                                                  *(__array **)
                                                   ((long)alice._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl + 8) = &out_encoded_signature;
                                                  *(TimeResults **)
                                                   ((long)alice._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl + 0x10) = &results_2;
                                                  *(TimeResults **)
                                                   ((long)alice._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl + 0x18) = &results_5;
                                                  bVar2 = TimeFunctionParallel
                                                                    ((TimeResults *)&durations,
                                                                     (function<bool_()> *)&alice);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&alice);
                                                  if (!bVar2) {
LAB_0012959e:
                                                    pcVar19 = "Failed to time MLDSA65_verify.\n";
                                                    sStack_55c0 = 0x1f;
                                                    goto LAB_00129654;
                                                  }
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&name,
                                                             "MLDSA verify (valid signature)",
                                                             &local_55a9);
                                                  TimeResults::Print((TimeResults *)&durations,&name
                                                                    );
                                                  std::__cxx11::string::~string((string *)&name);
                                                  *(byte *)((long)out_encoded_signature._M_t.
                                                                                                                                    
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl + 0x2a) =
                                                       *(byte *)((long)out_encoded_signature._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl + 0x2a) ^ 0x42;
                                                  local_5558 = (code *)0x0;
                                                  pcStack_5550 = (code *)0x0;
                                                  alice_msg_len = 0;
                                                  uStack_5560 = (string *)0x0;
                                                  alice_msg_len = (size_t)operator_new(0x20);
                                                  *(__single_object **)alice_msg_len = &pub_2;
                                                  *(__array **)(alice_msg_len + 8) =
                                                       &out_encoded_signature;
                                                  *(TimeResults **)(alice_msg_len + 0x10) =
                                                       &results_2;
                                                  *(TimeResults **)(alice_msg_len + 0x18) =
                                                       &results_5;
                                                  pcStack_5550 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1206:39)>
                                                  ::_M_invoke;
                                                  local_5558 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1206:39)>
                                                  ::_M_manager;
                                                  bVar2 = TimeFunctionParallel
                                                                    ((TimeResults *)&durations,
                                                                     (function<bool_()> *)
                                                                     &alice_msg_len);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&alice_msg_len);
                                                  if (!bVar2) goto LAB_0012959e;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&name,
                                                             "MLDSA verify (invalid signature)",
                                                             &local_55a9);
                                                  TimeResults::Print((TimeResults *)&durations,&name
                                                                    );
                                                  std::__cxx11::string::~string((string *)&name);
                                                  bVar2 = true;
                                                }
                                                else {
                                                  pcVar19 = 
                                                  "Failed to time MLDSA65_parse_public_key.\n";
                                                  sStack_55c0 = 0x29;
LAB_00129654:
                                                  fwrite(pcVar19,sStack_55c0,1,_stderr);
                                                  bVar2 = false;
                                                }
                                                std::
                                                unique_ptr<MLDSA65_public_key,_std::default_delete<MLDSA65_public_key>_>
                                                ::~unique_ptr(&pub_2);
                                              }
                                              else {
                                                fwrite("Failed to time MLDSA65_sign.\n",0x1d,1,
                                                       _stderr);
                                                bVar2 = false;
                                              }
                                              std::
                                              unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                              ::~unique_ptr(&out_encoded_signature);
                                              std::
                                              unique_ptr<MLDSA65_private_key,_std::default_delete<MLDSA65_private_key>_>
                                              ::~unique_ptr((
                                                  unique_ptr<MLDSA65_private_key,_std::default_delete<MLDSA65_private_key>_>
                                                  *)&results);
                                              std::
                                              unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                              ::~unique_ptr((
                                                  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                                  *)&e);
                                              if (!bVar2) goto LAB_0012819c;
                                            }
                                            if ((selected._M_string_length == 0) ||
                                               (bVar2 = std::operator!=(&selected,"ML-KEM-768"),
                                               !bVar2)) {
                                              memset(public_key,0x2a,0x440);
                                              alice._M_t.
                                              super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                              _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )public_key;
                                              bVar2 = TimeFunctionParallel
                                                                ((TimeResults *)&e,
                                                                 (function<bool_()> *)&alice);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)&alice);
                                              if (bVar2) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&ptr,
                                                           "ML-KEM-768 generate + decap",
                                                           (allocator<char> *)&name);
                                                TimeResults::Print((TimeResults *)&e,(string *)&ptr)
                                                ;
                                                std::__cxx11::string::~string((string *)&ptr);
                                                MLKEM768_generate_key
                                                          (fake_sha256_hash,(uint8_t *)0x0,
                                                           (MLKEM768_private_key *)&ptr);
                                                alice_msg_len = 0;
                                                uStack_5560 = (string *)0x0;
                                                local_5558 = (code *)0x0;
                                                pcStack_5550 = (code *)0x0;
                                                alice_msg_len = (size_t)operator_new(0x18);
                                                *(uint8_t **)alice_msg_len = fake_sha256_hash;
                                                *(string **)(alice_msg_len + 8) = &name;
                                                *(uint8_t **)(alice_msg_len + 0x10) = public_key;
                                                pcStack_5550 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1253:39)>
                                                  ::_M_invoke;
                                                local_5558 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1253:39)>
                                                  ::_M_manager;
                                                bVar2 = TimeFunctionParallel
                                                                  ((TimeResults *)&e,
                                                                   (function<bool_()> *)
                                                                   &alice_msg_len);
                                                std::_Function_base::~_Function_base
                                                          ((_Function_base *)&alice_msg_len);
                                                if (bVar2) {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&durations,
                                                             "ML-KEM-768 parse + encap",
                                                             (allocator<char> *)&results);
                                                  TimeResults::Print((TimeResults *)&e,
                                                                     (string *)&durations);
                                                  std::__cxx11::string::~string
                                                            ((string *)&durations);
                                                  goto LAB_00128be2;
                                                }
                                                pcVar19 = "Failed to time MLKEM768_encap.\n";
                                                sStack_55c0 = 0x1f;
                                              }
                                              else {
                                                pcVar19 = 
                                                "Failed to time MLKEM768_generate_key + MLKEM768_decap.\n"
                                                ;
                                                sStack_55c0 = 0x37;
                                              }
                                              goto LAB_0012971e;
                                            }
LAB_00128be2:
                                            if ((selected._M_string_length == 0) ||
                                               (bVar2 = std::operator!=(&selected,"ML-KEM-1024"),
                                               !bVar2)) {
                                              std::make_unique<MLKEM1024_private_key>();
                                              memset(&name,0x2a,0x620);
                                              public_key._24_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1285:39)>
                                                  ::_M_invoke;
                                              public_key._16_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1285:39)>
                                                  ::_M_manager;
                                              public_key._0_8_ = &e;
                                              public_key._8_8_ = &name;
                                              bVar2 = TimeFunctionParallel
                                                                ((TimeResults *)&durations,
                                                                 (function<bool_()> *)public_key);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)public_key);
                                              if (bVar2) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&ptr,
                                                           "ML-KEM-1024 generate + decap",
                                                           (allocator<char> *)fake_sha256_hash);
                                                TimeResults::Print((TimeResults *)&durations,
                                                                   (string *)&ptr);
                                                std::__cxx11::string::~string((string *)&ptr);
                                                MLKEM1024_generate_key
                                                          (fake_sha256_hash,(uint8_t *)0x0,
                                                           (MLKEM1024_private_key *)
                                                           e._M_t.
                                                  super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_st_*,_false>.
                                                  _M_head_impl);
                                                alice._M_t.
                                                super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  )0x0;
                                                alice._M_t.
                                                super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )operator_new(0x18);
                                                *(uint8_t **)
                                                 alice._M_t.
                                                 super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                 _M_head_impl = fake_sha256_hash;
                                                *(string **)
                                                 ((long)alice._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl + 8) = (string *)&ptr;
                                                *(string **)
                                                 ((long)alice._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl + 0x10) = &name;
                                                bVar2 = TimeFunctionParallel
                                                                  ((TimeResults *)&durations,
                                                                   (function<bool_()> *)&alice);
                                                std::_Function_base::~_Function_base
                                                          ((_Function_base *)&alice);
                                                if (bVar2) {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&alice_msg_len,
                                                             "ML-KEM-1024 parse + encap",
                                                             (allocator<char> *)&results);
                                                  TimeResults::Print((TimeResults *)&durations,
                                                                     (string *)&alice_msg_len);
                                                  std::__cxx11::string::~string
                                                            ((string *)&alice_msg_len);
                                                }
                                                else {
                                                  fwrite("Failed to time MLKEM768_encap.\n",0x1f,1,
                                                         _stderr);
                                                }
                                                std::
                                                unique_ptr<MLKEM1024_private_key,_std::default_delete<MLKEM1024_private_key>_>
                                                ::~unique_ptr((
                                                  unique_ptr<MLKEM1024_private_key,_std::default_delete<MLKEM1024_private_key>_>
                                                  *)&e);
                                                if (bVar2) goto LAB_00128d77;
                                              }
                                              else {
                                                fwrite(
                                                  "Failed to time MLKEM768_generate_key + MLKEM768_decap.\n"
                                                  ,0x37,1,_stderr);
                                                std::
                                                unique_ptr<MLKEM1024_private_key,_std::default_delete<MLKEM1024_private_key>_>
                                                ::~unique_ptr((
                                                  unique_ptr<MLKEM1024_private_key,_std::default_delete<MLKEM1024_private_key>_>
                                                  *)&e);
                                              }
                                              goto LAB_0012819c;
                                            }
LAB_00128d77:
                                            if ((selected._M_string_length == 0) ||
                                               (lVar9 = std::__cxx11::string::find
                                                                  ((char *)&selected,0x23028c),
                                               lVar9 != -1)) {
                                              fake_sha256_hash[0] = '\0';
                                              fake_sha256_hash[1] = '\0';
                                              fake_sha256_hash[2] = '\0';
                                              fake_sha256_hash[3] = '\0';
                                              fake_sha256_hash[4] = '\0';
                                              fake_sha256_hash[5] = '\0';
                                              fake_sha256_hash[6] = '\0';
                                              fake_sha256_hash[7] = '\0';
                                              fake_sha256_hash[8] = '\0';
                                              fake_sha256_hash[9] = '\0';
                                              fake_sha256_hash[10] = '\0';
                                              fake_sha256_hash[0xb] = '\0';
                                              fake_sha256_hash[0xc] = '\0';
                                              fake_sha256_hash[0xd] = '\0';
                                              fake_sha256_hash[0xe] = '\0';
                                              fake_sha256_hash[0xf] = '\0';
                                              fake_sha256_hash._24_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1328:39)>
                                                  ::_M_invoke;
                                              fake_sha256_hash._16_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1328:39)>
                                                  ::_M_manager;
                                              bVar2 = TimeFunctionParallel
                                                                ((TimeResults *)&e,
                                                                 (function<bool_()> *)
                                                                 fake_sha256_hash);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)fake_sha256_hash);
                                              if (bVar2) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&ptr,
                                                           "SLHDSA-SHA2-128s key generation",
                                                           (allocator<char> *)&name);
                                                TimeResults::Print((TimeResults *)&e,(string *)&ptr)
                                                ;
                                                std::__cxx11::string::~string((string *)&ptr);
                                                SLHDSA_SHA2_128S_generate_key
                                                          (public_key,(uint8_t *)&name);
                                                alice._M_t.
                                                super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )&name;
                                                bVar2 = TimeFunctionParallel
                                                                  ((TimeResults *)&e,
                                                                   (function<bool_()> *)&alice);
                                                std::_Function_base::~_Function_base
                                                          ((_Function_base *)&alice);
                                                if (bVar2) {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&ptr,
                                                             "SLHDSA-SHA2-128s signing",
                                                             (allocator<char> *)&durations);
                                                  TimeResults::Print((TimeResults *)&e,
                                                                     (string *)&ptr);
                                                  std::__cxx11::string::~string((string *)&ptr);
                                                  SLHDSA_SHA2_128S_sign
                                                            ((uint8_t *)&ptr,(uint8_t *)&name,"",6,
                                                             (uint8_t *)0x0,0);
                                                  pcStack_5550 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1359:39)>
                                                  ::_M_invoke;
                                                  local_5558 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1359:39)>
                                                  ::_M_manager;
                                                  alice_msg_len = (size_t)public_key;
                                                  uStack_5560 = (string *)&ptr;
                                                  bVar2 = TimeFunctionParallel
                                                                    ((TimeResults *)&e,
                                                                     (function<bool_()> *)
                                                                     &alice_msg_len);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&alice_msg_len);
                                                  if (!bVar2) {
                                                    pcVar19 = "SLHDSA-SHA2-128s verify failed.\n";
                                                    sStack_55c0 = 0x20;
                                                    goto LAB_0012971e;
                                                  }
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&durations,
                                                             "SLHDSA-SHA2-128s verify",
                                                             (allocator<char> *)&results);
                                                  TimeResults::Print((TimeResults *)&e,
                                                                     (string *)&durations);
                                                  std::__cxx11::string::~string
                                                            ((string *)&durations);
                                                  goto LAB_00128f51;
                                                }
                                              }
                                              goto LAB_0012819c;
                                            }
LAB_00128f51:
                                            if ((selected._M_string_length == 0) ||
                                               (lVar9 = std::__cxx11::string::find
                                                                  ((char *)&selected,0x230306),
                                               lVar9 != -1)) {
                                              RAND_bytes((uchar *)&ptr,0x40);
                                              name._M_string_length = 0;
                                              name.field_2._8_8_ =
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1385:41)>
                                                  ::_M_invoke;
                                              name.field_2._M_allocated_capacity =
                                                   (size_type)
                                                   std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1385:41)>
                                                  ::_M_manager;
                                              name._M_dataplus._M_p = (pointer)&ptr;
                                              bVar2 = TimeFunctionParallel
                                                                ((TimeResults *)&alice_msg_len,
                                                                 (function<bool_()> *)&name);
                                              std::_Function_base::~_Function_base
                                                        ((_Function_base *)&name);
                                              if (bVar2) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)fake_sha256_hash,
                                                           "hash-to-curve P256_XMD:SHA-256_SSWU_RO_"
                                                           ,(allocator<char> *)&durations);
                                                TimeResults::Print((TimeResults *)&alice_msg_len,
                                                                   (string *)fake_sha256_hash);
                                                std::__cxx11::string::~string
                                                          ((string *)fake_sha256_hash);
                                                public_key[8] = '\0';
                                                public_key[9] = '\0';
                                                public_key[10] = '\0';
                                                public_key[0xb] = '\0';
                                                public_key[0xc] = '\0';
                                                public_key[0xd] = '\0';
                                                public_key[0xe] = '\0';
                                                public_key[0xf] = '\0';
                                                public_key._24_8_ =
                                                     std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1396:41)>
                                                  ::_M_invoke;
                                                public_key._16_8_ =
                                                     std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1396:41)>
                                                  ::_M_manager;
                                                public_key._0_8_ = &ptr;
                                                bVar2 = TimeFunctionParallel
                                                                  ((TimeResults *)&alice_msg_len,
                                                                   (function<bool_()> *)public_key);
                                                std::_Function_base::~_Function_base
                                                          ((_Function_base *)public_key);
                                                if (bVar2) {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)fake_sha256_hash,
                                                                                                                          
                                                  "hash-to-curve P384_XMD:SHA-384_SSWU_RO_",
                                                  (allocator<char> *)&durations);
                                                  TimeResults::Print((TimeResults *)&alice_msg_len,
                                                                     (string *)fake_sha256_hash);
                                                  std::__cxx11::string::~string
                                                            ((string *)fake_sha256_hash);
                                                  alice._M_t.
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )&ptr;
                                                  bVar2 = TimeFunctionParallel
                                                                    ((TimeResults *)&alice_msg_len,
                                                                     (function<bool_()> *)&alice);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&alice);
                                                  if (!bVar2) {
                                                    pcVar19 = "hash-to-scalar failed.\n";
                                                    goto LAB_00129537;
                                                  }
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)fake_sha256_hash,
                                                             "hash-to-scalar P384_XMD:SHA-512",
                                                             (allocator<char> *)&durations);
                                                  TimeResults::Print((TimeResults *)&alice_msg_len,
                                                                     (string *)fake_sha256_hash);
                                                  std::__cxx11::string::~string
                                                            ((string *)fake_sha256_hash);
                                                  goto LAB_00129108;
                                                }
                                              }
                                              pcVar19 = "hash-to-curve failed.\n";
                                              sStack_55c0 = 0x16;
                                              goto LAB_0012971e;
                                            }
LAB_00129108:
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_5358,
                                                       "TrustToken-Exp1-Batch1",
                                                       (allocator<char> *)&durations);
                                            pTVar16 = TRUST_TOKEN_experiment_v1();
                                            bVar2 = SpeedTrustToken(&local_5358,pTVar16,1,&selected)
                                            ;
                                            bVar1 = true;
                                            if (bVar2) {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_5378,
                                                         "TrustToken-Exp1-Batch10",
                                                         (allocator<char> *)&e);
                                              pTVar16 = TRUST_TOKEN_experiment_v1();
                                              bVar2 = SpeedTrustToken(&local_5378,pTVar16,10,
                                                                      &selected);
                                              bVar1 = true;
                                              if (bVar2) {
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_5398,
                                                           "TrustToken-Exp2VOPRF-Batch1",
                                                           (allocator<char> *)&results);
                                                pTVar16 = TRUST_TOKEN_experiment_v2_voprf();
                                                bVar2 = SpeedTrustToken(&local_5398,pTVar16,1,
                                                                        &selected);
                                                bVar1 = true;
                                                if (bVar2) {
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_53b8,
                                                             "TrustToken-Exp2VOPRF-Batch10",
                                                             (allocator<char> *)&results_2);
                                                  pTVar16 = TRUST_TOKEN_experiment_v2_voprf();
                                                  bVar2 = SpeedTrustToken(&local_53b8,pTVar16,10,
                                                                          &selected);
                                                  bVar1 = true;
                                                  if (bVar2) {
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_53d8,
                                                               "TrustToken-Exp2PMB-Batch1",
                                                               (allocator<char> *)&results_5);
                                                    pTVar16 = TRUST_TOKEN_experiment_v2_pmb();
                                                    bVar2 = SpeedTrustToken(&local_53d8,pTVar16,1,
                                                                            &selected);
                                                    bVar1 = true;
                                                    if (bVar2) {
                                                      std::__cxx11::string::
                                                      string<std::allocator<char>>
                                                                ((string *)&local_53f8,
                                                                 "TrustToken-Exp2PMB-Batch10",
                                                                 (allocator<char> *)
                                                                 &out_encoded_signature);
                                                      pTVar16 = TRUST_TOKEN_experiment_v2_pmb();
                                                      bVar2 = SpeedTrustToken(&local_53f8,pTVar16,10
                                                                              ,&selected);
                                                      bVar1 = true;
                                                      if (bVar2) {
                                                        if ((selected._M_string_length == 0) ||
                                                           (lVar9 = std::__cxx11::string::find
                                                                              ((char *)&selected,
                                                                               0x230573),
                                                           lVar9 != -1)) {
                                                          ptr = (char *)0x0;
                                                          _uStack_2870 = (TimeResults *)0x0;
                                                          local_2860 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1450:39)>
                                                  ::_M_invoke;
                                                  local_2868 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1450:39)>
                                                  ::_M_manager;
                                                  bVar2 = TimeFunctionParallel
                                                                    ((TimeResults *)fake_sha256_hash
                                                                     ,(function<bool_()> *)&ptr);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&ptr);
                                                  if (!bVar2) {
                                                    fwrite("base64 decode failed.\n",0x16,1,_stderr)
                                                    ;
                                                    goto LAB_00129767;
                                                  }
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&name,"base64 decode",
                                                             (allocator<char> *)public_key);
                                                  TimeResults::PrintWithBytes
                                                            ((TimeResults *)fake_sha256_hash,&name,
                                                             0x4f8);
                                                  std::__cxx11::string::~string((string *)&name);
                                                  }
                                                  if (selected._M_string_length != 0) {
                                                    bVar1 = false;
                                                    lVar9 = std::__cxx11::string::find
                                                                      ((char *)&selected,0x23059f);
                                                    if (lVar9 == -1) goto LAB_00129767;
                                                  }
                                                  alice._M_t.
                                                  super___uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_spake2_ctx_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_spake2_ctx_st_*,_false>.
                                                  _M_head_impl = (
                                                  __uniq_ptr_data<spake2_ctx_st,_bssl::internal::Deleter,_true,_true>
                                                  )(
                                                  __uniq_ptr_impl<spake2_ctx_st,_bssl::internal::Deleter>
                                                  )0x0;
                                                  local_5508 = g_chunk_lengths.
                                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  puVar20 = g_chunk_lengths.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  do {
                                                    bVar1 = puVar20 != local_5508;
                                                    if (puVar20 == local_5508) break;
                                                    __n = *puVar20;
                                                    std::
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::vector((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)public_key,__n,(allocator_type *)&name);
                                                  ptr = (char *)&alice;
                                                  _uStack_2870 = public_key;
                                                  local_2860 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1473:41)>
                                                  ::_M_invoke;
                                                  local_2868 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1473:41)>
                                                  ::_M_manager;
                                                  bVar2 = TimeFunctionParallel
                                                                    ((TimeResults *)&alice_msg_len,
                                                                     (function<bool_()> *)&ptr);
                                                  std::_Function_base::~_Function_base
                                                            ((_Function_base *)&ptr);
                                                  if (bVar2) {
                                                    ChunkLenSuffix_abi_cxx11_
                                                              ((string *)fake_sha256_hash,__n);
                                                    std::operator+(&name,"SipHash-2-4",
                                                                   (string *)fake_sha256_hash);
                                                    TimeResults::PrintWithBytes
                                                              ((TimeResults *)&alice_msg_len,&name,
                                                               __n);
                                                    std::__cxx11::string::~string((string *)&name);
                                                    std::__cxx11::string::~string
                                                              ((string *)fake_sha256_hash);
                                                  }
                                                  else {
                                                    fwrite("SIPHASH_24 failed.\n",0x13,1,_stderr);
                                                    ERR_print_errors_fp(_stderr);
                                                  }
                                                  std::
                                                  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ::~_Vector_base((
                                                  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)public_key);
                                                  puVar20 = puVar20 + 1;
                                                  } while (bVar2);
                                                  }
LAB_00129767:
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_53f8);
                                                  }
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_53d8);
                                                  }
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_53b8);
                                                }
                                                std::__cxx11::string::~string((string *)&local_5398)
                                                ;
                                              }
                                              std::__cxx11::string::~string((string *)&local_5378);
                                            }
                                            psVar18 = &local_5358;
                                            goto LAB_00128197;
                                          }
                                          alice_msg_len = 0;
                                          uStack_5560 = (string *)0x0;
                                          pcStack_5550 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1028:39)>
                                                  ::_M_invoke;
                                          local_5558 = std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1028:39)>
                                                  ::_M_manager;
                                          bVar2 = TimeFunctionParallel
                                                            (&results_5,
                                                             (function<bool_()> *)&alice_msg_len);
                                          std::_Function_base::~_Function_base
                                                    ((_Function_base *)&alice_msg_len);
                                          if (!bVar2) {
                                            pcVar19 = "Failed to time HRSS_generate_key.\n";
                                            sStack_55c0 = 0x22;
                                            goto LAB_0012971e;
                                          }
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&ptr,"HRSS generate",
                                                     (allocator<char> *)&name);
                                          TimeResults::Print(&results_5,(string *)&ptr);
                                          std::__cxx11::string::~string((string *)&ptr);
                                          RAND_bytes((uchar *)&name,0x598);
                                          iVar3 = HRSS_generate_key((HRSS_public_key *)
                                                                    fake_sha256_hash,
                                                                    (HRSS_private_key *)&ptr,
                                                                    (uint8_t *)&name);
                                          if (iVar3 == 0) goto LAB_0012819c;
                                          durations.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                          durations.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                               (pointer)std::
                                                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:1049:39)>
                                                  ::_M_manager;
                                          durations.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start =
                                               (pointer)fake_sha256_hash;
                                          bVar2 = TimeFunctionParallel
                                                            (&results_5,
                                                             (function<bool_()> *)&durations);
                                          std::_Function_base::~_Function_base
                                                    ((_Function_base *)&durations);
                                          if (bVar2) {
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)public_key,"HRSS encap",
                                                       (allocator<char> *)&alice);
                                            TimeResults::Print(&results_5,(string *)public_key);
                                            std::__cxx11::string::~string((string *)public_key);
                                            RAND_bytes(public_key,0x578);
                                            iVar3 = HRSS_encap((uint8_t *)&alice,(uint8_t *)&e,
                                                               (HRSS_public_key *)fake_sha256_hash,
                                                               public_key);
                                            if (iVar3 == 0) goto LAB_0012819c;
                                            results.num_calls = (uint64_t)&ptr;
                                            results.us = (uint64_t)&alice;
                                            bVar2 = TimeFunctionParallel
                                                              (&results_5,
                                                               (function<bool_()> *)&results);
                                            std::_Function_base::~_Function_base
                                                      ((_Function_base *)&results);
                                            if (bVar2) {
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&results_2,"HRSS decap",
                                                         (allocator<char> *)&out_encoded_signature);
                                              TimeResults::Print(&results_5,(string *)&results_2);
                                              std::__cxx11::string::~string((string *)&results_2);
                                              goto LAB_0012851e;
                                            }
                                          }
                                          pcVar19 = "Failed to time HRSS_encap.\n";
                                          sStack_55c0 = 0x1b;
LAB_0012971e:
                                          fwrite(pcVar19,sStack_55c0,1,_stderr);
                                        }
                                        else {
LAB_0012818f:
                                          psVar18 = (string *)&ptr;
LAB_00128197:
                                          std::__cxx11::string::~string((string *)psVar18);
                                        }
LAB_0012819c:
                                        std::__cxx11::string::~string((string *)&local_5338);
                                      }
                                      std::__cxx11::string::~string((string *)&local_5318);
                                    }
                                    std::__cxx11::string::~string((string *)&local_52f8);
                                  }
                                  std::__cxx11::string::~string((string *)&local_52d8);
                                }
                                std::__cxx11::string::~string((string *)&local_52b8);
                              }
                              std::__cxx11::string::~string((string *)&local_5298);
                            }
                            std::__cxx11::string::~string((string *)&local_5278);
                          }
                          std::__cxx11::string::~string((string *)&local_5258);
                        }
                        std::__cxx11::string::~string((string *)&local_5238);
                      }
                      std::__cxx11::string::~string((string *)&local_5218);
                    }
                    std::__cxx11::string::~string((string *)&local_51f8);
                  }
                  std::__cxx11::string::~string((string *)&local_51d8);
                }
                std::__cxx11::string::~string((string *)&local_51b8);
              }
              std::__cxx11::string::~string((string *)&local_5198);
            }
            std::__cxx11::string::~string((string *)&local_5178);
          }
          std::__cxx11::string::~string((string *)&local_5158);
        }
        std::__cxx11::string::~string((string *)&local_5138);
      }
      std::__cxx11::string::~string((string *)&local_5118);
    }
    std::__cxx11::string::~string((string *)&local_50f8);
    std::__cxx11::string::~string((string *)&local_5418);
    std::__cxx11::string::~string((string *)&sig_len);
    std::__cxx11::string::~string((string *)&key);
    if (bVar1) goto LAB_00127fa2;
    bVar1 = true;
    if (g_print_json == '\x01') {
      puts("\n]");
    }
  }
  else {
LAB_00127ede:
    psVar18 = (string *)&key;
LAB_00127f9d:
    std::__cxx11::string::~string((string *)psVar18);
LAB_00127fa2:
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&selected);
LAB_00127fae:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&args_map._M_t);
  return bVar1;
code_r0x00126a1a:
  name._M_dataplus._M_p = pcVar8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&g_chunk_lengths,(unsigned_long *)&name);
  pcVar21 = pcVar19;
  if (pcVar19 != pcVar22) {
    if (*pcVar19 != ',') {
LAB_00127ea3:
      fwrite("Error parsing -chunks argument\n",0x1f,1,_stderr);
      goto LAB_00127fa2;
    }
    pcVar21 = pcVar19 + 1;
  }
  goto LAB_001269dd;
}

Assistant:

bool Speed(const std::vector<std::string> &args) {
  std::map<std::string, std::string> args_map;
  if (!ParseKeyValueArguments(&args_map, args, kArguments)) {
    PrintUsage(kArguments);
    return false;
  }

  std::string selected;
  if (args_map.count("-filter") != 0) {
    selected = args_map["-filter"];
  }

  if (args_map.count("-json") != 0) {
    g_print_json = true;
  }

  if (args_map.count("-timeout") != 0) {
    g_timeout_seconds = atoi(args_map["-timeout"].c_str());
  }

#if defined(OPENSSL_THREADS)
  if (args_map.count("-threads") != 0) {
    g_threads = atoi(args_map["-threads"].c_str());
  }
#endif

  if (args_map.count("-chunks") != 0) {
    g_chunk_lengths.clear();
    const char *start = args_map["-chunks"].data();
    const char *end = start + args_map["-chunks"].size();
    while (start != end) {
      errno = 0;
      char *ptr;
      unsigned long long val = strtoull(start, &ptr, 10);
      if (ptr == start /* no numeric characters found */ ||
          errno == ERANGE /* overflow */ || static_cast<size_t>(val) != val) {
        fprintf(stderr, "Error parsing -chunks argument\n");
        return false;
      }
      g_chunk_lengths.push_back(static_cast<size_t>(val));
      start = ptr;
      if (start != end) {
        if (*start != ',') {
          fprintf(stderr, "Error parsing -chunks argument\n");
          return false;
        }
        start++;
      }
    }
  }

  // kTLSADLen is the number of bytes of additional data that TLS passes to
  // AEADs.
  static const size_t kTLSADLen = 13;
  // kLegacyADLen is the number of bytes that TLS passes to the "legacy" AEADs.
  // These are AEADs that weren't originally defined as AEADs, but which we use
  // via the AEAD interface. In order for that to work, they have some TLS
  // knowledge in them and construct a couple of the AD bytes internally.
  static const size_t kLegacyADLen = kTLSADLen - 2;

  if (g_print_json) {
    puts("[");
  }
  if (!SpeedRSA(selected) ||
      !SpeedAEAD(EVP_aead_aegis_128l(), "AEGIS-128L", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aegis_128x2(), "AEGIS-128X2", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aegis_256(), "AEGIS-256", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_gcm(), "AES-128-GCM", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_256_gcm(), "AES-256-GCM", kTLSADLen, selected) ||
      !SpeedAEAD(EVP_aead_chacha20_poly1305(), "ChaCha20-Poly1305", kTLSADLen,
                 selected) ||
      !SpeedAEAD(EVP_aead_des_ede3_cbc_sha1_tls(), "DES-EDE3-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_cbc_sha1_tls(), "AES-128-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_256_cbc_sha1_tls(), "AES-256-CBC-SHA1",
                 kLegacyADLen, selected) ||
      !SpeedAEADOpen(EVP_aead_aes_128_cbc_sha1_tls(), "AES-128-CBC-SHA1",
                     kLegacyADLen, selected) ||
      !SpeedAEADOpen(EVP_aead_aes_256_cbc_sha1_tls(), "AES-256-CBC-SHA1",
                     kLegacyADLen, selected) ||
      !SpeedAEAD(EVP_aead_aes_128_gcm_siv(), "AES-128-GCM-SIV", kTLSADLen,
                 selected) ||
      !SpeedAEAD(EVP_aead_aes_256_gcm_siv(), "AES-256-GCM-SIV", kTLSADLen,
                 selected) ||
      !SpeedAEADOpen(EVP_aead_aes_128_gcm_siv(), "AES-128-GCM-SIV", kTLSADLen,
                     selected) ||
      !SpeedAEADOpen(EVP_aead_aes_256_gcm_siv(), "AES-256-GCM-SIV", kTLSADLen,
                     selected) ||
      !SpeedAEAD(EVP_aead_aes_128_ccm_bluetooth(), "AES-128-CCM-Bluetooth",
                 kTLSADLen, selected) ||
      !SpeedAESBlock("AES-128", 128, selected) ||
      !SpeedAESBlock("AES-256", 256, selected) ||
      !SpeedHash(EVP_sha1(), "SHA-1", selected) ||
      !SpeedHash(EVP_sha256(), "SHA-256", selected) ||
      !SpeedHash(EVP_sha512(), "SHA-512", selected) ||
      !SpeedHash(EVP_blake2b256(), "BLAKE2b-256", selected) ||
      !SpeedRandom(selected) ||       //
      !SpeedECDH(selected) ||         //
      !SpeedECDSA(selected) ||        //
      !Speed25519(selected) ||        //
      !SpeedSPAKE2(selected) ||       //
      !SpeedScrypt(selected) ||       //
      !SpeedRSAKeyGen(selected) ||    //
      !SpeedHRSS(selected) ||         //
      !SpeedKyber(selected) ||        //
      !SpeedMLDSA(selected) ||        //
      !SpeedMLKEM(selected) ||        //
      !SpeedMLKEM1024(selected) ||    //
      !SpeedSLHDSA(selected) ||       //
      !SpeedHashToCurve(selected) ||  //
      !SpeedTrustToken("TrustToken-Exp1-Batch1", TRUST_TOKEN_experiment_v1(), 1,
                       selected) ||
      !SpeedTrustToken("TrustToken-Exp1-Batch10", TRUST_TOKEN_experiment_v1(),
                       10, selected) ||
      !SpeedTrustToken("TrustToken-Exp2VOPRF-Batch1",
                       TRUST_TOKEN_experiment_v2_voprf(), 1, selected) ||
      !SpeedTrustToken("TrustToken-Exp2VOPRF-Batch10",
                       TRUST_TOKEN_experiment_v2_voprf(), 10, selected) ||
      !SpeedTrustToken("TrustToken-Exp2PMB-Batch1",
                       TRUST_TOKEN_experiment_v2_pmb(), 1, selected) ||
      !SpeedTrustToken("TrustToken-Exp2PMB-Batch10",
                       TRUST_TOKEN_experiment_v2_pmb(), 10, selected) ||
      !SpeedBase64(selected) ||  //
      !SpeedSipHash(selected)) {
    return false;
  }
#if defined(BORINGSSL_FIPS)
  if (!SpeedSelfTest(selected)) {
    return false;
  }
#endif
  if (g_print_json) {
    puts("\n]");
  }

  return true;
}